

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool Minisat::updateOptions(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 in_EAX;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  undefined8 uStack_40;
  undefined8 uStack_38;
  int count;
  
  uStack_40 = 0x111206;
  uStack_38._0_4_ = in_EAX;
  pcVar6 = getenv("MINISAT_RUNTIME_ARGS");
  if (pcVar6 != (char *)0x0) {
    uStack_40 = 0x111217;
    pcVar6 = strdup(pcVar6);
    if (pcVar6 != (char *)0x0) {
      uStack_40 = 0x11122b;
      sVar7 = strlen(pcVar6);
      uVar8 = sVar7 * 8 + 0x1f & 0xfffffffffffffff0;
      lVar2 = -uVar8;
      uStack_38 = CONCAT44(1,(undefined4)uStack_38);
      *(char **)((long)&uStack_38 - uVar8) = "mergesat";
      pcVar10 = pcVar6 + -1;
      do {
        cVar1 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x111272;
        iVar5 = isspace((int)cVar1);
        uVar4 = uStack_38;
      } while (iVar5 != 0);
      while (uStack_38 = uVar4, cVar1 != '\0') {
        uStack_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
        lVar9 = (long)uStack_38._4_4_;
        uStack_38._0_4_ = (undefined4)uVar4;
        uStack_38 = CONCAT44(uStack_38._4_4_ + 1,(undefined4)uStack_38);
        ((char **)((long)&uStack_38 + lVar2))[lVar9] = pcVar10;
        cVar1 = *pcVar10;
        pcVar3 = pcVar10;
        while( true ) {
          if (cVar1 == '\0') goto LAB_001112ba;
          pcVar10 = pcVar3 + 1;
          *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11129c;
          iVar5 = isspace((int)cVar1);
          if (iVar5 != 0) break;
          cVar1 = *pcVar10;
          pcVar3 = pcVar10;
        }
        *pcVar3 = '\0';
        uVar4 = uStack_38;
        cVar1 = *pcVar10;
      }
LAB_001112ba:
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1112c8;
      parseOptions((int *)((long)&uStack_38 + 4),(char **)((long)&uStack_38 + lVar2),false);
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1112d0;
      free(pcVar6);
    }
  }
  return false;
}

Assistant:

bool MERGESAT_NSPACE::updateOptions()
{
    if (getenv("MINISAT_RUNTIME_ARGS") == NULL) return false;

    char *args = strdup(getenv("MINISAT_RUNTIME_ARGS")); // make sure it's freed
    if (!args) return false;
    char *original_args = args;

    const size_t len = strlen(args);

    char *argv[len + 2];
    int count = 1;

    argv[0] = "mergesat";
    while (isspace(*args)) ++args;
    while (*args) {
        argv[count++] = args;                    // store current argument
        while (*args && !isspace(*args)) ++args; // skip current token
        if (!*args) break;
        *args = (char)0; // separate current token
        ++args;
    }

    parseOptions(count, argv, false);
    free(original_args);
    return false;
}